

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

void __thiscall
lscpp::stdio_transporter::write_message_impl(stdio_transporter *this,string *str,bool close_file)

{
  void *__buf;
  size_t __n;
  size_t sizeof_reply;
  char *cstr;
  bool close_file_local;
  string *str_local;
  stdio_transporter *this_local;
  
  __buf = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  write(1,__buf,__n);
  anon_unknown_0::log_out_message(&this->comm_logger_,__buf,__n,close_file);
  return;
}

Assistant:

void stdio_transporter::write_message_impl(std::string str, bool close_file) {
  const char *cstr = str.c_str();
  std::size_t sizeof_reply = str.size();
  ::write(stdout_fileno, cstr, sizeof_reply);
  log_out_message(comm_logger_, cstr, sizeof_reply, close_file);
}